

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::UniformBlockLayoutQualifierConflictTest::testInit
          (UniformBlockLayoutQualifierConflictTest *this)

{
  value_type local_20;
  testCase test_case;
  GLuint stage;
  GLuint qualifier;
  UniformBlockLayoutQualifierConflictTest *this_local;
  
  for (test_case.m_stage = COMPUTE; test_case.m_stage < GEOMETRY;
      test_case.m_stage = test_case.m_stage + VERTEX) {
    for (test_case.m_qualifier = DEFAULT; test_case.m_qualifier < (QUALIFIERS_MAX|SHARED);
        test_case.m_qualifier = test_case.m_qualifier + STD140) {
      local_20.m_qualifier = test_case.m_stage;
      local_20.m_stage = test_case.m_qualifier;
      std::
      vector<gl4cts::EnhancedLayouts::UniformBlockLayoutQualifierConflictTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::UniformBlockLayoutQualifierConflictTest::testCase>_>
      ::push_back(&this->m_test_cases,&local_20);
    }
  }
  return;
}

Assistant:

void UniformBlockLayoutQualifierConflictTest::testInit()
{
	for (GLuint qualifier = 0; qualifier < QUALIFIERS_MAX; ++qualifier)
	{
		for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
		{
			testCase test_case = { (QUALIFIERS)qualifier, (Utils::Shader::STAGES)stage };

			m_test_cases.push_back(test_case);
		}
	}
}